

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O0

Ch __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::PercentDecodeStream::Take(PercentDecodeStream *this)

{
  char cVar1;
  char cVar2;
  Ch h;
  int j;
  Ch c;
  PercentDecodeStream *this_local;
  Ch local_1;
  
  if ((*this->src_ == '%') && (this->src_ + 3 <= this->end_)) {
    this->src_ = this->src_ + 1;
    c = '\0';
    for (j = 0; j < 2; j = j + 1) {
      cVar2 = c * '\x10';
      cVar1 = *this->src_;
      if ((cVar1 < '0') || ('9' < cVar1)) {
        if ((cVar1 < 'A') || ('F' < cVar1)) {
          if ((cVar1 < 'a') || ('f' < cVar1)) {
            this->valid_ = false;
            return '\0';
          }
          c = cVar2 + cVar1 + -0x57;
        }
        else {
          c = cVar2 + cVar1 + -0x37;
        }
      }
      else {
        c = cVar2 + cVar1 + -0x30;
      }
      this->src_ = this->src_ + 1;
    }
    local_1 = c;
  }
  else {
    this->valid_ = false;
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

Ch Take() {
            if (*src_ != '%' || src_ + 3 > end_) { // %XY triplet
                valid_ = false;
                return 0;
            }
            src_++;
            Ch c = 0;
            for (int j = 0; j < 2; j++) {
                c = static_cast<Ch>(c << 4);
                Ch h = *src_;
                if      (h >= '0' && h <= '9') c = static_cast<Ch>(c + h - '0');
                else if (h >= 'A' && h <= 'F') c = static_cast<Ch>(c + h - 'A' + 10);
                else if (h >= 'a' && h <= 'f') c = static_cast<Ch>(c + h - 'a' + 10);
                else {
                    valid_ = false;
                    return 0;
                }
                src_++;
            }
            return c;
        }